

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

regexp_flag mjs::parse_regexp_flags(global_object *global,string *s)

{
  regexp_flag rVar1;
  uint *puVar2;
  wchar_t *extraout_RDX;
  wstring_view s_00;
  
  puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)s);
  s_00._M_len = puVar2 + 1;
  s_00._M_str = extraout_RDX;
  rVar1 = regexp_flags_from_string((mjs *)(ulong)*puVar2,s_00);
  return rVar1;
}

Assistant:

regexp_flag parse_regexp_flags(global_object& global, const string& s) {
    try {
        return regexp_flags_from_string(s.view());
    } catch (const std::exception& e) {
        throw native_error_exception{native_error_type::syntax, global.stack_trace(), e.what()};
    }
}